

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeNF
          (ChElementHexaCorot_8 *this,double U,double V,double W,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  ShapeVector N;
  ShapeVector local_c0 [2];
  
  ShapeFunctions(this,local_c0,U,V,W);
  *detJ = this->Volume * 0.125;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[0] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,1);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[0] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,2);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[0] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,3);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[1] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,4);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[1] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,5);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[1] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,6);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[2] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,7);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[2] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,8);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[2] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,9);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[3] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,10);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[3] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0xb);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[3] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0xc);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[4] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0xd);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[4] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0xe);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[4] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0xf);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[5] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0x10);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[5] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0x11);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[5] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0x12);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[6] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0x13);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[6] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0x14);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[6] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0x15);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[7] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0x16);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[7] * dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0x17);
  *pSVar3 = local_c0[0].super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
            m_data.array[7] * dVar1;
  return;
}

Assistant:

void ChElementHexaCorot_8::ComputeNF(const double U,
                                     const double V,
                                     const double W,
                                     ChVectorDynamic<>& Qi,
                                     double& detJ,
                                     const ChVectorDynamic<>& F,
                                     ChVectorDynamic<>* state_x,
                                     ChVectorDynamic<>* state_w) {
    // evaluate shape functions (in compressed vector), btw. not dependant on state
    ShapeVector N;
    ShapeFunctions(N, U, V, W);  // note: U,V,W in -1..1 range

    detJ = this->GetVolume() / 8.0;

    Qi(0) = N(0) * F(0);
    Qi(1) = N(0) * F(1);
    Qi(2) = N(0) * F(2);
    Qi(3) = N(1) * F(0);
    Qi(4) = N(1) * F(1);
    Qi(5) = N(1) * F(2);
    Qi(6) = N(2) * F(0);
    Qi(7) = N(2) * F(1);
    Qi(8) = N(2) * F(2);
    Qi(9) = N(3) * F(0);
    Qi(10) = N(3) * F(1);
    Qi(11) = N(3) * F(2);
    Qi(12) = N(4) * F(0);
    Qi(13) = N(4) * F(1);
    Qi(14) = N(4) * F(2);
    Qi(15) = N(5) * F(0);
    Qi(16) = N(5) * F(1);
    Qi(17) = N(5) * F(2);
    Qi(18) = N(6) * F(0);
    Qi(19) = N(6) * F(1);
    Qi(20) = N(6) * F(2);
    Qi(21) = N(7) * F(0);
    Qi(22) = N(7) * F(1);
    Qi(23) = N(7) * F(2);
}